

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O2

void __thiscall bsplib::exception::~exception(exception *this)

{
  *(undefined ***)this = &PTR__exception_0011bd20;
  std::__cxx11::string::~string((string *)&this->m_buf);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stream);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

~exception() throw() 
    {}